

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

ostream * deqp::gles3::Functional::operator<<(ostream *str,VarValue *varValue)

{
  DataType dataType;
  DataType DVar1;
  uint uVar2;
  char *pcVar3;
  ostream *poVar4;
  Hex<8UL> hex;
  ulong uVar5;
  ulong uVar6;
  HexBool local_38;
  HexFloat local_34;
  
  dataType = (varValue->type->m_data).basic.type;
  DVar1 = glu::getDataTypeScalarType(dataType);
  uVar2 = glu::getDataTypeScalarSize(dataType);
  if (1 < (int)uVar2) {
    pcVar3 = glu::getDataTypeName(dataType);
    poVar4 = std::operator<<(str,pcVar3);
    std::operator<<(poVar4,"(");
  }
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    if (uVar5 != 0) {
      std::operator<<(str,", ");
    }
    if (DVar1 == TYPE_BOOL) {
      local_38.value = *(deUint32 *)((long)varValue->value + uVar5 * 4);
      operator<<(str,&local_38);
    }
    else if (DVar1 == TYPE_INT) {
      std::ostream::operator<<(str,*(int *)((long)varValue->value + uVar5 * 4));
    }
    else if (DVar1 == TYPE_UINT) {
      hex.value._4_4_ = 0;
      hex.value._0_4_ = *(uint *)((long)varValue->value + uVar5 * 4);
      tcu::Format::operator<<(str,hex);
    }
    else if (DVar1 == TYPE_FLOAT) {
      local_34.value = *(float *)((long)varValue->value + uVar5 * 4);
      operator<<(str,&local_34);
    }
  }
  if (1 < (int)uVar2) {
    std::operator<<(str,")");
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const VarValue& varValue)
{
	DE_ASSERT(varValue.type.isBasicType());

	const glu::DataType		basicType		= varValue.type.getBasicType();
	const glu::DataType		scalarType		= glu::getDataTypeScalarType(basicType);
	const int				numComponents	= glu::getDataTypeScalarSize(basicType);

	if (numComponents > 1)
		str << glu::getDataTypeName(basicType) << "(";

	for (int compNdx = 0; compNdx < numComponents; compNdx++)
	{
		if (compNdx != 0)
			str << ", ";

		switch (scalarType)
		{
			case glu::TYPE_FLOAT:	str << HexFloat(((const float*)varValue.value)[compNdx]);			break;
			case glu::TYPE_INT:		str << ((const deInt32*)varValue.value)[compNdx];					break;
			case glu::TYPE_UINT:	str << tcu::toHex(((const deUint32*)varValue.value)[compNdx]);		break;
			case glu::TYPE_BOOL:	str << HexBool(((const deUint32*)varValue.value)[compNdx]);			break;

			default:
				DE_ASSERT(false);
		}
	}

	if (numComponents > 1)
		str << ")";

	return str;
}